

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O1

ISchemaValidator * __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::CreateSchemaValidator
          (GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
           *this,SchemaType *root,bool inheritContinueOnErrors)

{
  uint uVar1;
  GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  *schemaDocument;
  uint uVar2;
  char *pcVar3;
  CrtAllocator *pCVar4;
  GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
  *this_00;
  char *pcVar5;
  
  pcVar3 = internal::Stack<rapidjson::CrtAllocator>::Push<char>(&this->documentStack_,1);
  *pcVar3 = '\0';
  pcVar3 = (this->documentStack_).stack_;
  pcVar5 = (this->documentStack_).stackTop_;
  if (pcVar5 != pcVar3) {
    pcVar5 = pcVar5 + -1;
    (this->documentStack_).stackTop_ = pcVar5;
    if (this->stateAllocator_ == (CrtAllocator *)0x0) {
      pCVar4 = (CrtAllocator *)operator_new(1);
      this->ownStateAllocator_ = pCVar4;
      this->stateAllocator_ = pCVar4;
    }
    this_00 = (GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
               *)malloc(0xe0);
    schemaDocument = this->schemaDocument_;
    uVar1 = this->depth_;
    if (this->stateAllocator_ == (CrtAllocator *)0x0) {
      pCVar4 = (CrtAllocator *)operator_new(1);
      this->ownStateAllocator_ = pCVar4;
      this->stateAllocator_ = pCVar4;
    }
    GenericSchemaValidator
              (this_00,schemaDocument,root,pcVar3,(long)pcVar5 - (long)pcVar3,uVar1 + 1,
               this->stateAllocator_,0x400,0x100);
    uVar2 = (*(this->
              super_ISchemaStateFactory<rapidjson::internal::Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>_>
              )._vptr_ISchemaStateFactory[10])(this);
    uVar1 = uVar2 & 0xfffffffe;
    if (inheritContinueOnErrors) {
      uVar1 = uVar2;
    }
    (*(this_00->super_ISchemaValidator)._vptr_ISchemaValidator[3])
              (&this_00->super_ISchemaValidator,(ulong)uVar1);
    return &this_00->super_ISchemaValidator;
  }
  __assert_fail("GetSize() >= count * sizeof(T)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/stack.h"
                ,0x8b,
                "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Pop(size_t) [Allocator = rapidjson::CrtAllocator, T = char]"
               );
}

Assistant:

virtual ISchemaValidator* CreateSchemaValidator(const SchemaType& root, const bool inheritContinueOnErrors) {
        *documentStack_.template Push<Ch>() = '\0';
        documentStack_.template Pop<Ch>(1);
        ISchemaValidator* sv = new (GetStateAllocator().Malloc(sizeof(GenericSchemaValidator))) GenericSchemaValidator(*schemaDocument_, root, documentStack_.template Bottom<char>(), documentStack_.GetSize(),
        depth_ + 1,
        &GetStateAllocator());
        sv->SetValidateFlags(inheritContinueOnErrors ? GetValidateFlags() : GetValidateFlags() & ~static_cast<unsigned>(kValidateContinueOnErrorFlag));
        return sv;
    }